

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_everything_together.cxx
# Opt level: O2

void __thiscall
simple_state_mgr::simple_state_mgr
          (simple_state_mgr *this,int32 srv_id,
          vector<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
          *cluster)

{
  strfmt<100> sStack_88;
  
  (this->super_state_mgr)._vptr_state_mgr = (_func_int **)&PTR__simple_state_mgr_00177978;
  this->srv_id_ = srv_id;
  std::
  vector<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  ::vector(&this->cluster_,cluster);
  (this->store_path_)._M_dataplus._M_p = (pointer)&(this->store_path_).field_2;
  (this->store_path_)._M_string_length = 0;
  (this->store_path_).field_2._M_local_buf[0] = '\0';
  sStack_88.fmt_ = "store%d";
  cornerstone::strfmt<100>::fmt<int>(&sStack_88,this->srv_id_);
  std::__cxx11::string::assign((char *)&this->store_path_);
  return;
}

Assistant:

simple_state_mgr(int32 srv_id, const std::vector<ptr<srv_config>>& cluster) : srv_id_(srv_id), cluster_(cluster)
    {
        store_path_ = sstrfmt("store%d").fmt(srv_id_);
    }